

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool google::protobuf::internal::IsMatchingCType(FieldDescriptor *field,int ctype)

{
  CppStringType CVar1;
  int ctype_local;
  FieldDescriptor *field_local;
  
  CVar1 = FieldDescriptor::cpp_string_type(field);
  if (CVar1 != kView) {
    if (CVar1 == kCord) {
      return ctype == 1;
    }
    if (CVar1 != kString) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                  ,0xbc);
    }
  }
  return ctype == 0;
}

Assistant:

bool IsMatchingCType(const FieldDescriptor* field, int ctype) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      return ctype == FieldOptions::CORD;
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString:
      return ctype == FieldOptions::STRING;
  }
  internal::Unreachable();
}